

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int runQMake(int argc,char **argv)

{
  int *piVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  FILE *pFVar4;
  qsizetype qVar5;
  Data *pDVar6;
  code *pcVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  iterator iVar12;
  iterator iVar13;
  ssize_t sVar14;
  MetaMakefileGenerator *pMVar15;
  code *pcVar16;
  QChar *pQVar17;
  char **argv_00;
  iterator copy;
  long in_FS_OFFSET;
  QLatin1String QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QStringView QVar21;
  bool success;
  QDir dir;
  QFileInfo fi;
  QMakeParser parser;
  ProFileCache proFileCache;
  QMakeVfs vfs;
  QMakeProject project;
  QMakeGlobals globals;
  DataPointer in_stack_fffffffffffff998;
  QString local_650;
  undefined1 local_638;
  undefined7 uStack_637;
  QString local_608;
  QArrayDataPointer<QString> local_5e8;
  undefined1 local_5c8 [16];
  QArrayData *local_5b8;
  BlockScope *pBStack_5b0;
  undefined1 *local_5a8;
  undefined1 *puStack_5a0;
  undefined1 *local_598;
  undefined1 *puStack_590;
  QArrayData *local_588;
  char16_t *pcStack_580;
  undefined1 *local_578;
  ProFileCache *pPStack_570;
  QMakeParserHandler *local_568;
  QMakeVfs *pQStack_560;
  ProFileCache local_550;
  QMakeProperty local_548;
  QString local_530;
  QString local_518;
  QMakeVfs local_4f9;
  QString local_4f8;
  code *local_4d8 [2];
  code *local_4c8;
  code *pcStack_4c0;
  QArrayData *local_228;
  QArrayData *local_210;
  QMakeGlobals local_1f0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QHashSeed::setDeterministicGlobalSeed();
  setvbuf(_stdout,(char *)0x0,2,0);
  if (((argc < 4) || (iVar10 = strcmp(argv[1],"-qtconf"), iVar10 != 0)) ||
     (iVar10 = strcmp(argv[3],"-install"), iVar10 != 0)) {
    if ((argc < 2) || (iVar10 = strcmp(argv[1],"-install"), iVar10 != 0)) {
      local_4f9 = (QMakeVfs)0xaa;
      QMakeVfs::QMakeVfs(&local_4f9);
      Option::vfs = &local_4f9;
      memset(&local_1f0,0xaa,0x1b8);
      QMakeGlobals::QMakeGlobals(&local_1f0);
      Option::globals = &local_1f0;
      uVar11 = Option::init((Option *)(ulong)(uint)argc,(EVP_PKEY_CTX *)argv);
      if (uVar11 == 0) {
        local_518.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_518.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_518.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        qmake_getpwd();
        QString::operator=(&Option::output_dir,(QString *)&local_518);
        QFile::fileName();
        if (local_4c8 == (code *)0x0) {
          bVar8 = false;
        }
        else {
          QFile::fileName();
          bVar8 = comparesEqual(&local_530,"-");
          bVar8 = !bVar8;
          if (&(local_530.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_530.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_530.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_530.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_530.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        if ((QArrayData *)local_4d8[0] != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_4d8[0] = *(int *)local_4d8[0] + -1;
          UNLOCK();
          if (*(int *)local_4d8[0] == 0) {
            QArrayData::deallocate((QArrayData *)local_4d8[0],2,0x10);
          }
        }
        if (bVar8) {
          local_5e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          QFileInfo::QFileInfo((QFileInfo *)&local_5e8,(QFileDevice *)Option::output);
          local_608.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          cVar9 = QFileInfo::isDir();
          if (cVar9 == '\0') {
            QFileInfo::absolutePath();
          }
          else {
            QFileInfo::absoluteFilePath();
          }
          QDir::cleanPath((QString *)((_Any_data *)local_4d8)->_M_pod_data);
          QDir::QDir((QDir *)&local_608,(QString *)((_Any_data *)local_4d8)->_M_pod_data);
          if ((QArrayData *)local_4d8[0] != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_4d8[0] = *(int *)local_4d8[0] + -1;
            UNLOCK();
            if (*(int *)local_4d8[0] == 0) {
              QArrayData::deallocate((QArrayData *)local_4d8[0],2,0x10);
            }
          }
          if ((ProFile *)local_5c8._0_8_ != (ProFile *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_5c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_5c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_5c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_5c8._0_8_,2,0x10);
            }
          }
          QDir::dirName();
          QVar18.m_data = (char *)0xa;
          QVar18.m_size = (qsizetype)local_4d8;
          cVar9 = QString::endsWith(QVar18,0x2a7e4b);
          if ((QArrayData *)local_4d8[0] != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_4d8[0] = *(int *)local_4d8[0] + -1;
            UNLOCK();
            if (*(int *)local_4d8[0] == 0) {
              QArrayData::deallocate((QArrayData *)local_4d8[0],2,0x10);
            }
          }
          if (cVar9 != '\0') {
            QVar19.m_data = (storage_type *)0x2;
            QVar19.m_size = (qsizetype)local_4d8;
            QString::fromUtf8(QVar19);
            local_4f8.d.d = (Data *)local_4d8[0];
            local_4f8.d.ptr = (char16_t *)local_4d8[1];
            local_4f8.d.size = (qsizetype)local_4c8;
            QDir::filePath((QString *)local_5c8);
            QDir::cleanPath((QString *)((_Any_data *)local_4d8)->_M_pod_data);
            QDir::setPath((QString *)&local_608);
            if ((QArrayData *)local_4d8[0] != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_4d8[0] = *(int *)local_4d8[0] + -1;
              UNLOCK();
              if (*(int *)local_4d8[0] == 0) {
                QArrayData::deallocate((QArrayData *)local_4d8[0],2,0x10);
              }
            }
            if ((ProFile *)local_5c8._0_8_ != (ProFile *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_5c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_5c8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_5c8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_5c8._0_8_,2,0x10);
              }
            }
            if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_4f8.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          QDir::path();
          pcVar7 = local_4c8;
          pcVar16 = local_4d8[0];
          pcVar3 = Option::output_dir.d.ptr;
          pDVar2 = Option::output_dir.d.d;
          local_4d8[0] = (code *)Option::output_dir.d.d;
          Option::output_dir.d.d = (Data *)pcVar16;
          Option::output_dir.d.ptr = (char16_t *)local_4d8[1];
          local_4d8[1] = (code *)pcVar3;
          local_4c8 = (code *)Option::output_dir.d.size;
          Option::output_dir.d.size = (qsizetype)pcVar7;
          if (pDVar2 != (Data *)0x0) {
            LOCK();
            (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
            }
          }
          local_4c8 = (code *)&DAT_aaaaaaaaaaaaaaaa;
          local_4d8[0] = (code *)&DAT_aaaaaaaaaaaaaaaa;
          local_4d8[1] = (code *)&DAT_aaaaaaaaaaaaaaaa;
          QFileInfo::absoluteFilePath();
          QDir::cleanPath((QString *)((_Any_data *)local_4d8)->_M_pod_data);
          if ((ProFile *)local_5c8._0_8_ != (ProFile *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_5c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_5c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_5c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_5c8._0_8_,2,0x10);
            }
          }
          QString::mid((longlong)local_5c8,(longlong)local_4d8);
          QFile::setFileName((QString *)Option::output);
          if ((ProFile *)local_5c8._0_8_ != (ProFile *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_5c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_5c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_5c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_5c8._0_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_4d8[0] != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_4d8[0] = *(int *)local_4d8[0] + -1;
            UNLOCK();
            if (*(int *)local_4d8[0] == 0) {
              QArrayData::deallocate((QArrayData *)local_4d8[0],2,0x10);
            }
          }
          QDir::~QDir((QDir *)&local_608);
          QFileInfo::~QFileInfo((QFileInfo *)&local_5e8);
        }
        local_548.settings = (QSettings *)&DAT_aaaaaaaaaaaaaaaa;
        local_548.m_values.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QMakeProperty::QMakeProperty(&local_548);
        if (Option::qmake_mode == QMAKE_SET_PROPERTY) {
          uVar11 = QMakeProperty::setProperty(&local_548,&Option::prop::properties);
        }
        else if (Option::qmake_mode == QMAKE_UNSET_PROPERTY) {
          QMakeProperty::unsetProperty(&local_548,&Option::prop::properties);
          uVar11 = 0;
        }
        else if (Option::qmake_mode == QMAKE_QUERY_PROPERTY) {
          local_4d8[1] = (code *)0x0;
          local_4d8[0] = qmakePropertyPrinter;
          pcStack_4c0 = std::
                        _Function_handler<void_(const_QList<std::pair<QString,_QString>_>_&),_void_(*)(const_QList<std::pair<QString,_QString>_>_&)>
                        ::_M_invoke;
          local_4c8 = std::
                      _Function_handler<void_(const_QList<std::pair<QString,_QString>_>_&),_void_(*)(const_QList<std::pair<QString,_QString>_>_&)>
                      ::_M_manager;
          uVar11 = QMakeProperty::queryProperty
                             (&local_548,&Option::prop::properties,(PropertyPrinter *)local_4d8);
          if (local_4c8 != (code *)0x0) {
            (*local_4c8)((_Any_data *)local_4d8,(_Any_data *)local_4d8,3);
          }
        }
        else {
          local_550.parsed_files.d = (QHash<int,_ProFileCache::Entry>)&DAT_aaaaaaaaaaaaaaaa;
          local_1f0.property = &local_548;
          ProFileCache::ProFileCache(&local_550);
          local_568 = (QMakeParserHandler *)&DAT_aaaaaaaaaaaaaaaa;
          pQStack_560 = (QMakeVfs *)&DAT_aaaaaaaaaaaaaaaa;
          local_578 = &DAT_aaaaaaaaaaaaaaaa;
          pPStack_570 = (ProFileCache *)&DAT_aaaaaaaaaaaaaaaa;
          local_588 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
          pcStack_580 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          local_598 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_590 = &DAT_aaaaaaaaaaaaaaaa;
          local_5a8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_5a0 = &DAT_aaaaaaaaaaaaaaaa;
          local_5b8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
          pBStack_5b0 = (BlockScope *)&DAT_aaaaaaaaaaaaaaaa;
          local_5c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_5c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          Option::proFileCache = &local_550;
          QMakeParser::QMakeParser
                    ((QMakeParser *)local_5c8,&local_550,&local_4f9,
                     (QMakeParserHandler *)&Option::evalHandler);
          Option::parser = (QMakeParser *)local_5c8;
          memset((_Any_data *)local_4d8,0xaa,0x2e0);
          QMakeProject::QMakeProject((QMakeProject *)local_4d8);
          local_5e8.d = (Data *)0x0;
          local_5e8.ptr = (QString *)0x0;
          local_5e8.size = 0;
          if (Option::qmake_mode == QMAKE_GENERATE_PROJECT) {
            QVar20.m_data = &DAT_00000008;
            QVar20.m_size = (qsizetype)&local_4f8;
            QString::fromUtf8(QVar20);
            local_608.d.d = local_4f8.d.d;
            local_608.d.ptr = local_4f8.d.ptr;
            local_608.d.size = local_4f8.d.size;
            QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                      ((QMovableArrayOps<QString> *)&local_5e8,local_5e8.size,&local_608);
            QList<QString>::end((QList<QString> *)&local_5e8);
            if (&(local_608.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_608.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_608.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_608.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_608.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          else {
            QArrayDataPointer<QString>::operator=(&local_5e8,&Option::mkfile::project_files.d);
          }
          iVar12 = QList<QString>::begin((QList<QString> *)&local_5e8);
          iVar13 = QList<QString>::end((QList<QString> *)&local_5e8);
          if (iVar12.i == iVar13.i) {
            uVar11 = 0;
          }
          else {
            uVar11 = 0;
            do {
              if ((Option::qmake_mode & ~QMAKE_GENERATE_PROJECT) == QMAKE_GENERATE_MAKEFILE) {
                local_608.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_608.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_608.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                local_4f8.d.d = ((iVar12.i)->d).d;
                local_4f8.d.ptr = ((iVar12.i)->d).ptr;
                local_4f8.d.size = ((iVar12.i)->d).size;
                if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  (((QArrayData *)&((local_4f8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                  super___atomic_base<int>._M_i =
                       (((QArrayData *)&((local_4f8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                       super___atomic_base<int>._M_i + 1;
                  UNLOCK();
                }
                Option::fixString(&local_608,(QString)in_stack_fffffffffffff998,(uchar)&local_4f8);
                if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_4f8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                cVar9 = QFile::exists((QString *)&local_608);
                if (cVar9 == '\0') {
                  runQMake();
                  uVar11 = 2;
                  bVar8 = false;
                }
                else {
                  if (Option::debug_level != 0) {
                    QDir::toNativeSeparators((QString *)&local_638);
                    QString::toLatin1_helper_inplace((QString *)&local_4f8);
                    pQVar17 = (QChar *)local_4f8.d.ptr;
                    if ((QChar *)local_4f8.d.ptr == (QChar *)0x0) {
                      pQVar17 = (QChar *)&QByteArray::_empty;
                    }
                    debug_msg_internal(1,"Resetting dir to: %s",pQVar17);
                    if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_4f8.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_4f8.d.d)->super_QArrayData,1,0x10);
                      }
                    }
                    piVar1 = (int *)CONCAT71(uStack_637,local_638);
                    if (piVar1 != (int *)0x0) {
                      LOCK();
                      *piVar1 = *piVar1 + -1;
                      UNLOCK();
                      if (*piVar1 == 0) {
                        QArrayData::deallocate((QArrayData *)CONCAT71(uStack_637,local_638),2,0x10);
                      }
                    }
                  }
                  qmake_setpwd(&local_518);
                  qVar5 = local_608.d.size;
                  pcVar3 = local_608.d.ptr;
                  pcVar16 = (code *)0x2f;
                  QVar21.m_data = local_608.d.ptr;
                  QVar21.m_size = local_608.d.size;
                  iVar10 = QtPrivate::lastIndexOf(QVar21,-1,L'/',CaseSensitive);
                  if (iVar10 != -1) {
                    if (Option::debug_level != 0) {
                      if ((code *)(long)iVar10 < (ulong)qVar5) {
                        QString::QString(&local_650,(QChar *)pcVar3,(longlong)(long)iVar10);
                      }
                      else {
                        local_650.d.d = local_608.d.d;
                        local_650.d.ptr = pcVar3;
                        local_650.d.size = qVar5;
                        if (&(local_608.d.d)->super_QArrayData != (QArrayData *)0x0) {
                          LOCK();
                          ((local_608.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i = ((local_608.d.d)->super_QArrayData).ref_._q_value.
                                  super___atomic_base<int>._M_i + 1;
                          UNLOCK();
                        }
                      }
                      QDir::toNativeSeparators((QString *)&local_638);
                      QString::toLatin1_helper_inplace((QString *)&local_4f8);
                      pQVar17 = (QChar *)local_4f8.d.ptr;
                      if ((QChar *)local_4f8.d.ptr == (QChar *)0x0) {
                        pQVar17 = (QChar *)&QByteArray::_empty;
                      }
                      debug_msg_internal(1,"Changing dir to: %s",pQVar17);
                      if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_4f8.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_4f8.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_4f8.d.d)->super_QArrayData,1,0x10);
                        }
                      }
                      piVar1 = (int *)CONCAT71(uStack_637,local_638);
                      if (piVar1 != (int *)0x0) {
                        LOCK();
                        *piVar1 = *piVar1 + -1;
                        UNLOCK();
                        if (*piVar1 == 0) {
                          QArrayData::deallocate
                                    ((QArrayData *)CONCAT71(uStack_637,local_638),2,0x10);
                        }
                      }
                      if (&(local_650.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_650.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_650.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_650.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_650.d.d)->super_QArrayData,2,0x10);
                        }
                      }
                    }
                    pcVar16 = (code *)(long)iVar10;
                    if (pcVar16 < (ulong)local_608.d.size) {
                      QString::QString(&local_4f8,(QChar *)local_608.d.ptr,(longlong)pcVar16);
                    }
                    else {
                      local_4f8.d.d = local_608.d.d;
                      local_4f8.d.ptr = local_608.d.ptr;
                      local_4f8.d.size = local_608.d.size;
                      if (&(local_608.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_608.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_608.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + 1;
                        UNLOCK();
                      }
                    }
                    bVar8 = qmake_setpwd(&local_4f8);
                    if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_4f8.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_4f8.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    pFVar4 = _stderr;
                    if (!bVar8) {
                      if (pcVar16 < (ulong)local_608.d.size) {
                        QString::QString(&local_650,(QChar *)local_608.d.ptr,(longlong)pcVar16);
                      }
                      else {
                        local_650.d.d = local_608.d.d;
                        local_650.d.ptr = local_608.d.ptr;
                        local_650.d.size = local_608.d.size;
                        if (&(local_608.d.d)->super_QArrayData != (QArrayData *)0x0) {
                          LOCK();
                          ((local_608.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i = ((local_608.d.d)->super_QArrayData).ref_._q_value.
                                  super___atomic_base<int>._M_i + 1;
                          UNLOCK();
                        }
                      }
                      QDir::toNativeSeparators((QString *)&local_638);
                      QString::toLatin1_helper_inplace((QString *)&local_4f8);
                      pQVar17 = (QChar *)local_4f8.d.ptr;
                      if ((QChar *)local_4f8.d.ptr == (QChar *)0x0) {
                        pQVar17 = (QChar *)&QByteArray::_empty;
                      }
                      fprintf(pFVar4,"Cannot find directory: %s\n",pQVar17);
                      if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_4f8.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_4f8.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_4f8.d.d)->super_QArrayData,1,0x10);
                        }
                      }
                      piVar1 = (int *)CONCAT71(uStack_637,local_638);
                      if (piVar1 != (int *)0x0) {
                        LOCK();
                        *piVar1 = *piVar1 + -1;
                        UNLOCK();
                        if (*piVar1 == 0) {
                          QArrayData::deallocate
                                    ((QArrayData *)CONCAT71(uStack_637,local_638),2,0x10);
                        }
                      }
                      if (&(local_650.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_650.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_650.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_650.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_650.d.d)->super_QArrayData,2,0x10);
                        }
                      }
                    }
                    if (CARRY8(~(ulong)pcVar16,local_608.d.size)) {
                      QString::QString(&local_4f8,(QChar *)(local_608.d.ptr + (long)(pcVar16 + 1)),
                                       (longlong)(local_608.d.size + ~(ulong)pcVar16));
                    }
                    else {
                      local_4f8.d.d = local_608.d.d;
                      local_4f8.d.ptr = local_608.d.ptr;
                      local_4f8.d.size = local_608.d.size;
                      if (&(local_608.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_608.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_608.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + 1;
                        UNLOCK();
                      }
                    }
                    pcVar16 = (code *)local_4f8.d.size;
                    pDVar6 = local_4f8.d.d;
                    pcVar3 = local_608.d.ptr;
                    pDVar2 = local_608.d.d;
                    local_4f8.d.d = local_608.d.d;
                    local_608.d.d = pDVar6;
                    local_608.d.ptr = local_4f8.d.ptr;
                    local_4f8.d.ptr = pcVar3;
                    local_4f8.d.size = local_608.d.size;
                    local_608.d.size = (qsizetype)pcVar16;
                    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                           -1;
                      UNLOCK();
                      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                          0) {
                        QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
                      }
                    }
                  }
                  Option::prepareProject(&local_608);
                  sVar14 = QMakeProject::read((QMakeProject *)local_4d8,(int)&local_608,(void *)0x3,
                                              (size_t)pcVar16);
                  if ((char)sVar14 == '\0') {
                    runQMake();
                    uVar11 = 3;
                    bVar8 = false;
                  }
                  else {
                    bVar8 = true;
                    if (Option::mkfile::do_preprocess == true) {
                      QMakeProject::dump((QMakeProject *)local_4d8);
                      bVar8 = false;
                    }
                  }
                }
                if (&(local_608.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_608.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_608.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_608.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_608.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (bVar8) goto LAB_00294c88;
              }
              else {
LAB_00294c88:
                local_638 = (QString)0x1;
                local_4f8.d.d = (Data *)0x0;
                local_4f8.d.ptr = (char16_t *)0x0;
                local_4f8.d.size = 0;
                pMVar15 = MetaMakefileGenerator::createMetaGenerator
                                    ((QMakeProject *)local_4d8,&local_4f8,false,(bool *)&local_638);
                if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_4f8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (local_638 == (QString)0x0) {
                  uVar11 = 3;
                }
                if ((pMVar15 != (MetaMakefileGenerator *)0x0) &&
                   (iVar10 = (*pMVar15->_vptr_MetaMakefileGenerator[4])(pMVar15), pFVar4 = _stderr,
                   (char)iVar10 == '\0')) {
                  if (Option::qmake_mode == QMAKE_GENERATE_PROJECT) {
                    runQMake();
                  }
                  else {
                    QDir::toNativeSeparators((QString *)&local_608);
                    QString::toLatin1_helper_inplace((QString *)&local_4f8);
                    pQVar17 = (QChar *)local_4f8.d.ptr;
                    if ((QChar *)local_4f8.d.ptr == (QChar *)0x0) {
                      pQVar17 = (QChar *)&QByteArray::_empty;
                    }
                    fprintf(pFVar4,"Unable to generate makefile for: %s\n",pQVar17);
                    if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_4f8.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_4f8.d.d)->super_QArrayData,1,0x10);
                      }
                    }
                    if (&(local_608.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_608.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_608.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_608.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_608.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                  }
                  uVar11 = 5;
                }
                if (pMVar15 != (MetaMakefileGenerator *)0x0) {
                  (*pMVar15->_vptr_MetaMakefileGenerator[1])(pMVar15);
                }
              }
              iVar12.i = iVar12.i + 1;
              iVar13 = QList<QString>::end((QList<QString> *)&local_5e8);
            } while (iVar12.i != iVar13.i);
          }
          qmakeClearCaches();
          QArrayDataPointer<QString>::~QArrayDataPointer(&local_5e8);
          if (local_210 != (QArrayData *)0x0) {
            LOCK();
            (local_210->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_210->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_210->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_210,2,0x10);
            }
          }
          if (local_228 != (QArrayData *)0x0) {
            LOCK();
            (local_228->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_228->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_228->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_228,2,0x10);
            }
          }
          QMakeEvaluator::~QMakeEvaluator((QMakeEvaluator *)local_4d8);
          if (local_588 != (QArrayData *)0x0) {
            LOCK();
            (local_588->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_588->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_588->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_588,2,0x10);
            }
          }
          if (local_5b8 != (QArrayData *)0x0) {
            LOCK();
            (local_5b8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_5b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_5b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_5b8,0x10,0x10);
            }
          }
          ProFileCache::~ProFileCache(&local_550);
        }
        QMakeProperty::~QMakeProperty(&local_548);
        if (&(local_518.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_518.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        uVar11 = uVar11 >> 2 & 1;
      }
      QMakeGlobals::~QMakeGlobals(&local_1f0);
      QMakeVfs::~QMakeVfs(&local_4f9);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return uVar11;
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar10 = argc + -2;
      argv_00 = argv + 2;
      goto LAB_002947d7;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    iVar10 = argc + -4;
    argv_00 = argv + 4;
LAB_002947d7:
    iVar10 = doInstall(iVar10,argv_00);
    return iVar10;
  }
  __stack_chk_fail();
}

Assistant:

int runQMake(int argc, char **argv)
{
    QHashSeed::setDeterministicGlobalSeed();

    // stderr is unbuffered by default, but stdout buffering depends on whether
    // there is a terminal attached. Buffering can make output from stderr and stdout
    // appear out of sync, so force stdout to be unbuffered as well.
    // This is particularly important for things like QtCreator and scripted builds.
    setvbuf(stdout, (char *)NULL, _IONBF, 0);

    // Workaround for inferior/missing command line tools on Windows: make our own!
    if (argc >= 4 && !strcmp(argv[1], "-qtconf") && !strcmp(argv[3], "-install"))
        return doInstall(argc - 4, argv + 4);
    if (argc >= 2 && !strcmp(argv[1], "-install"))
        return doInstall(argc - 2, argv + 2);

#ifdef Q_OS_WIN
    {
        // Support running as Visual C++'s compiler
        const wchar_t *cmdline = _wgetenv(L"MSC_CMD_FLAGS");
        if (!cmdline || !*cmdline)
            cmdline = _wgetenv(L"MSC_IDE_FLAGS");
        if (cmdline && *cmdline)
            return dumpMacros(cmdline);
    }
#endif

    QMakeVfs vfs;
    Option::vfs = &vfs;
    QMakeGlobals globals;
    Option::globals = &globals;

    // parse command line
    int ret = Option::init(argc, argv);
    if(ret != Option::QMAKE_CMDLINE_SUCCESS) {
        if ((ret & Option::QMAKE_CMDLINE_ERROR) != 0)
            return 1;
        return 0;
    }

    QString oldpwd = qmake_getpwd();

    Option::output_dir = oldpwd; //for now this is the output dir
    if (!Option::output.fileName().isEmpty() && Option::output.fileName() != "-") {
        // The output 'filename', as given by the -o option, might include one
        // or more directories, so we may need to rebase the output directory.
        QFileInfo fi(Option::output);

        QDir dir(QDir::cleanPath(fi.isDir() ? fi.absoluteFilePath() : fi.absolutePath()));

        // Don't treat Xcode project directory as part of OUT_PWD
        if (dir.dirName().endsWith(QLatin1String(".xcodeproj"))) {
            // Note: we're intentionally not using cdUp(), as the dir may not exist
            dir.setPath(QDir::cleanPath(dir.filePath("..")));
        }

        Option::output_dir = dir.path();
        QString absoluteFilePath = QDir::cleanPath(fi.absoluteFilePath());
        Option::output.setFileName(absoluteFilePath.mid(Option::output_dir.size() + 1));
    }

    QMakeProperty prop;
    switch (Option::qmake_mode) {
    case Option::QMAKE_QUERY_PROPERTY:
        return prop.queryProperty(Option::prop::properties);
    case Option::QMAKE_SET_PROPERTY:
        return prop.setProperty(Option::prop::properties);
    case Option::QMAKE_UNSET_PROPERTY:
        prop.unsetProperty(Option::prop::properties);
        return 0;
    default:
        break;
    }

    globals.setQMakeProperty(&prop);

    ProFileCache proFileCache;
    Option::proFileCache = &proFileCache;
    QMakeParser parser(&proFileCache, &vfs, &Option::evalHandler);
    Option::parser = &parser;

    QMakeProject project;
    int exit_val = 0;
    QStringList files;
    if(Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT)
        files << "(*hack*)"; //we don't even use files, but we do the for() body once
    else
        files = Option::mkfile::project_files;
    for(QStringList::Iterator pfile = files.begin(); pfile != files.end(); pfile++) {
        if(Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
           Option::qmake_mode == Option::QMAKE_GENERATE_PRL) {
            QString fn = Option::normalizePath(*pfile);
            if(!QFile::exists(fn)) {
                fprintf(stderr, "Cannot find file: %s.\n",
                        QDir::toNativeSeparators(fn).toLatin1().constData());
                exit_val = 2;
                continue;
            }

            //setup pwd properly
            debug_msg(1, "Resetting dir to: %s",
                      QDir::toNativeSeparators(oldpwd).toLatin1().constData());
            qmake_setpwd(oldpwd); //reset the old pwd
            int di = fn.lastIndexOf(QLatin1Char('/'));
            if(di != -1) {
                debug_msg(1, "Changing dir to: %s",
                          QDir::toNativeSeparators(fn.left(di)).toLatin1().constData());
                if(!qmake_setpwd(fn.left(di)))
                    fprintf(stderr, "Cannot find directory: %s\n",
                            QDir::toNativeSeparators(fn.left(di)).toLatin1().constData());
                fn = fn.right(fn.size() - di - 1);
            }

            Option::prepareProject(fn);

            // read project..
            if(!project.read(fn)) {
                fprintf(stderr, "Error processing project file: %s\n",
                        QDir::toNativeSeparators(*pfile).toLatin1().constData());
                exit_val = 3;
                continue;
            }
            if (Option::mkfile::do_preprocess) {
                project.dump();
                continue; //no need to create makefile
            }
        }

        bool success = true;
        MetaMakefileGenerator *mkfile = MetaMakefileGenerator::createMetaGenerator(&project, QString(), false, &success);
        if (!success)
            exit_val = 3;

        if (mkfile && !mkfile->write()) {
            if(Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT)
                fprintf(stderr, "Unable to generate project file.\n");
            else
                fprintf(stderr, "Unable to generate makefile for: %s\n",
                        QDir::toNativeSeparators(*pfile).toLatin1().constData());
            exit_val = 5;
        }
        delete mkfile;
        mkfile = nullptr;
    }
    qmakeClearCaches();
    return exit_val;
}